

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O1

void __thiscall echo_server::connection::connection(connection *this,echo_server *parent)

{
  timer *t;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  undefined8 uStack_60;
  connection *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  connection *local_38;
  char acStack_30 [8];
  code *local_28;
  code *pcStack_20;
  
  this->parent = parent;
  acStack_30[0] = '\0';
  acStack_30[1] = '\0';
  acStack_30[2] = '\0';
  acStack_30[3] = '\0';
  acStack_30[4] = '\0';
  acStack_30[5] = '\0';
  acStack_30[6] = '\0';
  acStack_30[7] = '\0';
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:10:32)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:10:32)>
             ::_M_manager;
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:12:8)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:12:8)>
             ::_M_manager;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_58 = this;
  local_38 = this;
  server_socket::accept
            ((server_socket *)&this->socket,(int)parent + 8,(sockaddr *)&local_38,
             (socklen_t *)&local_58);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  t = sysapi::epoll::get_timer(parent->ep);
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:15:46)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:15:46)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  timer_element::timer_element(&this->timer,t,(duration)0x37e11d600,(callback_t *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  this->start_offset = 0;
  this->end_offset = 0;
  return;
}

Assistant:

echo_server::connection::connection(echo_server *parent)
    : parent(parent)
    , socket(parent->ss.accept([this] {
        this->parent->connections.erase(this);
    }, [this] {
        process(true);
    }, client_socket::on_ready_t{}))
    , timer(parent->ep.get_timer(), timeout, [this] {
        this->parent->connections.erase(this);
    })
    , start_offset()
    , end_offset()
{}